

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

void __thiscall cmExportCommand::cmExportCommand(cmExportCommand *this)

{
  cmExportCommand *this_local;
  
  cmCommand::cmCommand(&this->super_cmCommand);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmExportCommand_00bebbc0;
  cmCommandArgumentsHelper::cmCommandArgumentsHelper(&this->Helper);
  cmCommandArgumentGroup::cmCommandArgumentGroup(&this->ArgumentGroup);
  cmCAStringVector::cmCAStringVector
            (&this->Targets,&this->Helper,"TARGETS",(cmCommandArgumentGroup *)0x0);
  cmCAEnabler::cmCAEnabler(&this->Append,&this->Helper,"APPEND",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->ExportSetName,&this->Helper,"EXPORT",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Namespace,&this->Helper,"NAMESPACE",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Filename,&this->Helper,"FILE",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler
            (&this->ExportOld,&this->Helper,"EXPORT_LINK_INTERFACE_LIBRARIES",&this->ArgumentGroup);
  cmCAString::cmCAString
            (&this->AndroidMKFile,&this->Helper,"ANDROID_MK",(cmCommandArgumentGroup *)0x0);
  std::__cxx11::string::string((string *)&this->ErrorMessage);
  this->ExportSet = (cmExportSet *)0x0;
  return;
}

Assistant:

cmExportCommand::cmExportCommand()
  : cmCommand()
  , ArgumentGroup()
  , Targets(&Helper, "TARGETS")
  , Append(&Helper, "APPEND", &ArgumentGroup)
  , ExportSetName(&Helper, "EXPORT", &ArgumentGroup)
  , Namespace(&Helper, "NAMESPACE", &ArgumentGroup)
  , Filename(&Helper, "FILE", &ArgumentGroup)
  , ExportOld(&Helper, "EXPORT_LINK_INTERFACE_LIBRARIES", &ArgumentGroup)
  , AndroidMKFile(&Helper, "ANDROID_MK")
{
  this->ExportSet = CM_NULLPTR;
}